

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O2

int json_object_array_move_cb(json_object *parent,size_t idx,json_object *value,void *priv)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  
  sVar2 = json_object_array_length(parent);
  if ((*priv == parent) + sVar2 < idx) {
    iVar1 = -1;
  }
  else {
    iVar1 = json_object_array_insert_idx(parent,idx,value);
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return iVar1;
}

Assistant:

static int json_object_array_move_cb(struct json_object *parent, size_t idx,
                                     struct json_object *value, void *priv)
{
	int rc;
	struct json_pointer_get_result *from = priv;
	size_t len = json_object_array_length(parent);

	/**
	 * If it's the same array parent, it means that we removed
	 * and element from it, so the length is temporarily reduced
	 * by 1, which means that if we try to move an element to
	 * the last position, we need to check the current length + 1
	 */
	if (parent == from->parent)
		len++;

	if (idx > len)
	{
		// Note: will propagate back out through json_pointer_set_with_array_cb()
		errno = EINVAL;
		return -1;
	}

	rc = json_object_array_insert_idx(parent, idx, value);
	if (rc < 0)
		errno = EINVAL;
	return rc;
}